

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O0

void __thiscall
SyncFixture_SyncToBadVersions_Test::TestBody(SyncFixture_SyncToBadVersions_Test *this)

{
  database *this_00;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  unique_lock<mock_mutex> local_108;
  undefined1 local_f8 [8];
  transaction_type t2;
  string local_b8;
  allocator local_91;
  string local_90;
  unique_lock<mock_mutex> local_60;
  undefined1 local_50 [8];
  transaction_type t1;
  SyncFixture_SyncToBadVersions_Test *this_local;
  
  t1.lock_._8_8_ = this;
  check_for_error<SyncFixture_SyncToBadVersions_Test::TestBody()::__0>
            ((anon_class_8_1_8991fb9c)this,unknown_revision);
  std::unique_lock<mock_mutex>::unique_lock
            (&local_60,(mutex_type *)&(this->super_SyncFixture).field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_50,&(this->super_SyncFixture).db_,
          &local_60);
  std::unique_lock<mock_mutex>::~unique_lock(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"a",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"first value",(allocator *)&t2.lock_.field_0xf);
  anon_unknown.dwarf_252d24::SyncFixture::add
            (&this->super_SyncFixture,(transaction_type *)local_50,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&t2.lock_.field_0xf);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pstore::transaction_base::commit((transaction_base *)local_50);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_50);
  this_00 = &(this->super_SyncFixture).db_;
  pstore::database::sync(this_00);
  std::unique_lock<mock_mutex>::unique_lock
            (&local_108,(mutex_type *)&(this->super_SyncFixture).field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_f8,this_00,&local_108);
  std::unique_lock<mock_mutex>::~unique_lock(&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"b",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"second value",&local_151);
  anon_unknown.dwarf_252d24::SyncFixture::add
            (&this->super_SyncFixture,(transaction_type *)local_f8,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  pstore::transaction_base::commit((transaction_base *)local_f8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_f8);
  check_for_error<SyncFixture_SyncToBadVersions_Test::TestBody()::__1>
            ((anon_class_8_1_8991fb9c)this,unknown_revision);
  return;
}

Assistant:

TEST_F (SyncFixture, SyncToBadVersions) {
    check_for_error ([this] () { db_.sync (1); }, pstore::error_code::unknown_revision);

    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "a", "first value");
        t1.commit ();
    }
    db_.sync (1);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "b", "second value");
        t2.commit ();
    }

    check_for_error ([this] () { db_.sync (3); }, pstore::error_code::unknown_revision);
}